

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O0

EStatusCode __thiscall Type1Input::ParseEncoding(Type1Input *this)

{
  int iVar1;
  BoolAndString local_178;
  BoolAndString local_150;
  string local_128;
  BoolAndString local_108;
  BoxingBaseWithRW<int,_STDStreamsReader<int>,_STDStreamsWriter<int>_> local_dc;
  BoolAndString local_d8;
  BoolAndString local_b0;
  undefined1 local_78 [8];
  BoolAndString token_1;
  EStatusCode local_44;
  int encodingIndex;
  EStatusCode status;
  BoolAndString token;
  Type1Input *this_local;
  
  token.second.field_2._8_8_ = this;
  InputPFBDecodeStream::GetNextToken_abi_cxx11_((BoolAndString *)&encodingIndex,&this->mPFBDecoder);
  local_44 = eSuccess;
  if (((byte)encodingIndex & 1) == 0) {
    this_local._4_4_ = eFailure;
    token_1.second.field_2._12_4_ = 1;
  }
  else {
    iVar1 = std::__cxx11::string::compare(&token.first);
    if (iVar1 == 0) {
      (this->mEncoding).EncodingType = eType1EncodingTypeStandardEncoding;
      InputPFBDecodeStream::GetNextToken_abi_cxx11_((BoolAndString *)local_78,&this->mPFBDecoder);
      if ((local_78[0] & 1U) == 0) {
        this_local._4_4_ = eFailure;
      }
      else {
        this_local._4_4_ = eSuccess;
      }
      token_1.second.field_2._12_4_ = 1;
      std::
      pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_78);
    }
    else {
      (this->mEncoding).EncodingType = eType1EncodingTypeCustom;
      do {
        if (((byte)encodingIndex & 1) == 0) break;
        InputPFBDecodeStream::GetNextToken_abi_cxx11_(&local_b0,&this->mPFBDecoder);
        std::
        pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&encodingIndex,&local_b0);
        std::
        pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_b0);
        iVar1 = std::__cxx11::string::compare(&token.first);
      } while (iVar1 != 0);
      if (((byte)encodingIndex & 1) == 0) {
        this_local._4_4_ = eFailure;
        token_1.second.field_2._12_4_ = 1;
      }
      else {
        while( true ) {
          if (((((byte)encodingIndex & 1) == 0) ||
              (iVar1 = std::__cxx11::string::compare(&token.first), iVar1 == 0)) ||
             (iVar1 = std::__cxx11::string::compare(&token.first), iVar1 == 0)) goto LAB_00287dbd;
          InputPFBDecodeStream::GetNextToken_abi_cxx11_(&local_d8,&this->mPFBDecoder);
          std::
          pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&encodingIndex,&local_d8);
          std::
          pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(&local_d8);
          if (((byte)encodingIndex & 1) == 0) goto LAB_00287dbd;
          BoxingBaseWithRW<int,_STDStreamsReader<int>,_STDStreamsWriter<int>_>::BoxingBaseWithRW
                    (&local_dc,(string *)&token);
          iVar1 = BoxingBase::operator_cast_to_int((BoxingBase *)&local_dc);
          if ((iVar1 < 0) || (0xff < iVar1)) break;
          InputPFBDecodeStream::GetNextToken_abi_cxx11_(&local_108,&this->mPFBDecoder);
          std::
          pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&encodingIndex,&local_108);
          std::
          pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(&local_108);
          if (((byte)encodingIndex & 1) == 0) goto LAB_00287dbd;
          FromPSName(&local_128,this,(string *)&token);
          std::__cxx11::string::operator=
                    ((string *)((this->mEncoding).mCustomEncoding + iVar1),(string *)&local_128);
          std::__cxx11::string::~string((string *)&local_128);
          InputPFBDecodeStream::GetNextToken_abi_cxx11_(&local_150,&this->mPFBDecoder);
          std::
          pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&encodingIndex,&local_150);
          std::
          pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(&local_150);
          if (((byte)encodingIndex & 1) == 0) goto LAB_00287dbd;
          InputPFBDecodeStream::GetNextToken_abi_cxx11_(&local_178,&this->mPFBDecoder);
          std::
          pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&encodingIndex,&local_178);
          std::
          pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(&local_178);
        }
        local_44 = eFailure;
LAB_00287dbd:
        if ((((byte)encodingIndex & 1) == 0) || (local_44 != eSuccess)) {
          this_local._4_4_ = eFailure;
          token_1.second.field_2._12_4_ = 1;
        }
        else {
          this_local._4_4_ = local_44;
          token_1.second.field_2._12_4_ = 1;
        }
      }
    }
  }
  std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&encodingIndex);
  return this_local._4_4_;
}

Assistant:

EStatusCode Type1Input::ParseEncoding()
{
	BoolAndString token = mPFBDecoder.GetNextToken();
	EStatusCode status = eSuccess;
	int encodingIndex = 0;

	if(!token.first)
		return eFailure;

	// checking for standard encoding
	if(token.second.compare("StandardEncoding") == 0)
	{
		mEncoding.EncodingType = eType1EncodingTypeStandardEncoding;

		// skip the def
		BoolAndString token = mPFBDecoder.GetNextToken();
		if(!token.first)
			return eFailure;
		return eSuccess;
	}

	// not standard encoding, parse custom encoding
	mEncoding.EncodingType = eType1EncodingTypeCustom;

	// hop hop...skip to the first dup
	while(token.first)
	{
		token = mPFBDecoder.GetNextToken();
		if(token.second.compare("dup") == 0)
			break;
	}
	if(!token.first)
		return eFailure;

	// k. now parse the repeats of "dup index charactername put"
	// till the first occurence of "readonly" or "def".
	while(token.first)
	{
		if(token.second.compare("readonly") == 0 || token.second.compare("def") == 0)
			break;

		// get the index from the next token
		token = mPFBDecoder.GetNextToken();
		if(!token.first)
			break;
		encodingIndex = Int(token.second);
		if(encodingIndex < 0 || encodingIndex > 255)
		{
			status = eFailure;
			break;
		}
		
		// get the glyph name
		token = mPFBDecoder.GetNextToken();
		if(!token.first)
			break;
		mEncoding.mCustomEncoding[encodingIndex] = FromPSName(token.second);

		// skip the put
		token = mPFBDecoder.GetNextToken();
		if(!token.first)
			break;

		// get next row first token [dup or end]
		token = mPFBDecoder.GetNextToken();
	}
	if(!token.first || status != eSuccess)
		return eFailure;

	return status;
}